

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

bool chaiscript::dispatch::Proxy_Function_Base::compare_types
               (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *tis,
               Function_Params *bvs,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  lVar4 = ((long)(tis->
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(tis->
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (lVar4 + -1 == (long)bvs->m_end - (long)bvs->m_begin >> 4) {
    lVar2 = 0;
    lVar3 = 0x18;
    do {
      lVar4 = lVar4 + -1;
      bVar5 = lVar4 == 0;
      if (bVar5) {
        return bVar5;
      }
      bVar1 = compare_type_to_param
                        ((Type_Info *)
                         ((long)&((tis->
                                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->m_type_info + lVar3),
                         (Boxed_Value *)
                         ((long)&(bvs->m_begin->m_data).
                                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar2),t_conversions);
      lVar2 = lVar2 + 0x10;
      lVar3 = lVar3 + 0x18;
    } while (bVar1);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool compare_types(const std::vector<Type_Info> &tis, const Function_Params &bvs, const Type_Conversions_State &t_conversions) noexcept {
        if (tis.size() - 1 != bvs.size()) {
          return false;
        } else {
          const size_t size = bvs.size();
          for (size_t i = 0; i < size; ++i) {
            if (!compare_type_to_param(tis[i + 1], bvs[i], t_conversions)) {
              return false;
            }
          }
        }
        return true;
      }